

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Gemm_x86_fma::forward
          (Gemm_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  Mat *this_00;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  int j;
  int iVar16;
  int iVar17;
  int iVar18;
  int *piVar19;
  uint broadcast_type_C;
  long lVar20;
  int k;
  uint uVar21;
  int iVar22;
  Mat *pMVar23;
  ulong uVar24;
  size_t sVar25;
  bool bVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  Mat *local_300;
  int TILE_N;
  undefined8 local_2c8;
  int local_2bc;
  ulong local_2b8;
  Gemm_x86_fma *local_2a0;
  ulong local_298;
  ulong local_290;
  ulong local_288;
  ulong local_280;
  ulong local_278;
  int TILE_K;
  Mat local_268;
  Mat local_218;
  Mat local_1c8;
  Mat *local_180;
  Mat local_178;
  ulong local_130;
  Mat local_128;
  Mat *local_d8;
  int TILE_M_3;
  int *local_c8;
  size_t local_c0;
  int local_b8;
  Allocator *local_b0;
  int local_a8;
  uint local_a4;
  undefined8 local_a0;
  int local_98;
  size_t local_90;
  int TILE_K_2;
  ulong local_80;
  int TILE_M;
  int *local_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  uint local_4c;
  undefined8 local_48;
  int local_40;
  size_t local_38;
  
  if ((this->super_Gemm).int8_scale_term != 0) {
    iVar7 = forward_int8(this,bottom_blobs,top_blobs,opt);
    return iVar7;
  }
  iVar7 = (this->super_Gemm).constantA;
  iVar11 = (this->super_Gemm).constantB;
  if (iVar11 != 0 && iVar7 != 0) {
    uVar10 = (this->super_Gemm).constantM;
LAB_00461beb:
    uVar21 = (this->super_Gemm).constantN;
  }
  else {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar7 == 0) {
      iVar17 = (this->super_Gemm).transA;
      if (iVar11 != 0) {
        if (iVar17 == 0) {
          uVar10 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
        }
        else {
          uVar10 = pMVar1->w;
        }
        goto LAB_00461beb;
      }
      if (iVar17 == 0) {
        uVar10 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
      else {
        uVar10 = pMVar1->w;
      }
      if ((this->super_Gemm).transB == 0) {
        uVar21 = pMVar1[1].w;
      }
      else {
        uVar21 = pMVar1[1].elempack * (&pMVar1[1].h)[(ulong)(pMVar1[1].dims == 3) * 2];
      }
    }
    else {
      uVar10 = (this->super_Gemm).constantM;
      if ((this->super_Gemm).transB == 0) {
        uVar21 = pMVar1->w;
      }
      else {
        uVar21 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
    }
  }
  local_268.cstep = 0;
  uVar27 = 0;
  uVar28 = 0;
  local_268.data = (void *)0x0;
  local_268.refcount._0_4_ = 0;
  local_268.refcount._4_4_ = 0;
  local_268.elemsize._0_4_ = 0;
  local_268.elemsize._4_4_ = 0;
  local_268.elempack = 0;
  local_268.allocator = (Allocator *)0x0;
  local_268.dims = 0;
  local_268.w = 0;
  local_268.h = 0;
  local_268.d = 0;
  local_268.c = 0;
  local_2a0 = this;
  if ((this->super_Gemm).constantC == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar20 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar1;
    if (iVar11 != 0 && iVar7 != 0) {
      bVar26 = true;
      if (lVar20 == 0x48) {
        local_268.data = pMVar1->data;
        piVar19 = pMVar1->refcount;
        sVar25 = pMVar1->elemsize;
        local_268.elempack = pMVar1->elempack;
        local_268.allocator = pMVar1->allocator;
        uVar27._0_4_ = pMVar1->dims;
        uVar27._4_4_ = pMVar1->w;
        uVar28._0_4_ = pMVar1->h;
        uVar28._4_4_ = pMVar1->d;
        local_268.c = pMVar1->c;
        local_268.cstep = pMVar1->cstep;
        if (piVar19 == (int *)0x0) {
          piVar19 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
          bVar26 = false;
        }
      }
      else {
        local_268.allocator = (Allocator *)0x0;
        local_268.elempack = 0;
        sVar25 = 0;
        piVar19 = (int *)0x0;
        local_268.data = (void *)0x0;
        local_268.c = 0;
        local_268.cstep = 0;
      }
      local_268.refcount._0_4_ = SUB84(piVar19,0);
      local_268.refcount._4_4_ = (uint)((ulong)piVar19 >> 0x20);
      local_268.elemsize._0_4_ = (int)sVar25;
      local_268.elemsize._4_4_ = (undefined4)(sVar25 >> 0x20);
      local_268.dims = (int)uVar27;
      local_268.w = (int)((ulong)uVar27 >> 0x20);
      local_268.h = (int)uVar28;
      local_268.d = (int)((ulong)uVar28 >> 0x20);
      if (!bVar26) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_268.allocator == (Allocator *)0x0) goto LAB_00464234;
          (*(local_268.allocator)->_vptr_Allocator[3])(local_268.allocator,local_268.data);
        }
      }
    }
    else if (iVar7 == 0) {
      if (iVar11 == 0) {
        bVar26 = true;
        if (lVar20 == 0xd8) {
          local_268.data = pMVar1[2].data;
          piVar19 = pMVar1[2].refcount;
          sVar25 = pMVar1[2].elemsize;
          local_268.elempack = pMVar1[2].elempack;
          local_268.allocator = pMVar1[2].allocator;
          uVar27._0_4_ = pMVar1[2].dims;
          uVar27._4_4_ = pMVar1[2].w;
          uVar28._0_4_ = pMVar1[2].h;
          uVar28._4_4_ = pMVar1[2].d;
          local_268.c = pMVar1[2].c;
          local_268.cstep = pMVar1[2].cstep;
          if (piVar19 == (int *)0x0) {
            piVar19 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar19 = *piVar19 + 1;
            UNLOCK();
            LOCK();
            *piVar19 = *piVar19 + 1;
            UNLOCK();
            bVar26 = false;
          }
        }
        else {
          local_268.cstep = 0;
          local_268.c = 0;
          local_268.allocator = (Allocator *)0x0;
          local_268.elempack = 0;
          sVar25 = 0;
          piVar19 = (int *)0x0;
          local_268.data = (void *)0x0;
        }
        local_268.refcount._0_4_ = SUB84(piVar19,0);
        local_268.refcount._4_4_ = (uint)((ulong)piVar19 >> 0x20);
        local_268.elemsize._0_4_ = (int)sVar25;
        local_268.elemsize._4_4_ = (undefined4)(sVar25 >> 0x20);
        local_268.dims = (int)uVar27;
        local_268.w = (int)((ulong)uVar27 >> 0x20);
        local_268.h = (int)uVar28;
        local_268.d = (int)((ulong)uVar28 >> 0x20);
        if (!bVar26) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_268.allocator == (Allocator *)0x0) goto LAB_00464234;
            (*(local_268.allocator)->_vptr_Allocator[3])(local_268.allocator,local_268.data);
          }
        }
      }
      else {
        bVar26 = true;
        if (lVar20 == 0x90) {
          local_268.data = pMVar1[1].data;
          piVar19 = pMVar1[1].refcount;
          sVar25 = pMVar1[1].elemsize;
          local_268.elempack = pMVar1[1].elempack;
          local_268.allocator = pMVar1[1].allocator;
          uVar27._0_4_ = pMVar1[1].dims;
          uVar27._4_4_ = pMVar1[1].w;
          uVar28._0_4_ = pMVar1[1].h;
          uVar28._4_4_ = pMVar1[1].d;
          local_268.c = pMVar1[1].c;
          local_268.cstep = pMVar1[1].cstep;
          if (piVar19 == (int *)0x0) {
            piVar19 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar19 = *piVar19 + 1;
            UNLOCK();
            LOCK();
            *piVar19 = *piVar19 + 1;
            UNLOCK();
            bVar26 = false;
          }
        }
        else {
          local_268.cstep = 0;
          local_268.c = 0;
          local_268.allocator = (Allocator *)0x0;
          local_268.elempack = 0;
          sVar25 = 0;
          piVar19 = (int *)0x0;
          local_268.data = (void *)0x0;
        }
        local_268.refcount._0_4_ = SUB84(piVar19,0);
        local_268.refcount._4_4_ = (uint)((ulong)piVar19 >> 0x20);
        local_268.elemsize._0_4_ = (int)sVar25;
        local_268.elemsize._4_4_ = (undefined4)(sVar25 >> 0x20);
        local_268.dims = (int)uVar27;
        local_268.w = (int)((ulong)uVar27 >> 0x20);
        local_268.h = (int)uVar28;
        local_268.d = (int)((ulong)uVar28 >> 0x20);
        if (!bVar26) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_268.allocator == (Allocator *)0x0) {
LAB_00464234:
              free(local_268.data);
            }
            else {
              (*(local_268.allocator)->_vptr_Allocator[3])(local_268.allocator,local_268.data);
            }
          }
        }
      }
    }
    else {
      bVar26 = true;
      if (lVar20 == 0x90) {
        local_268.data = pMVar1[1].data;
        piVar19 = pMVar1[1].refcount;
        sVar25 = pMVar1[1].elemsize;
        local_268.elempack = pMVar1[1].elempack;
        local_268.allocator = pMVar1[1].allocator;
        uVar27._0_4_ = pMVar1[1].dims;
        uVar27._4_4_ = pMVar1[1].w;
        uVar28._0_4_ = pMVar1[1].h;
        uVar28._4_4_ = pMVar1[1].d;
        local_268.c = pMVar1[1].c;
        local_268.cstep = pMVar1[1].cstep;
        if (piVar19 == (int *)0x0) {
          piVar19 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
          bVar26 = false;
        }
      }
      else {
        local_268.cstep = 0;
        local_268.c = 0;
        local_268.allocator = (Allocator *)0x0;
        local_268.elempack = 0;
        sVar25 = 0;
        piVar19 = (int *)0x0;
        local_268.data = (void *)0x0;
      }
      local_268.refcount._0_4_ = SUB84(piVar19,0);
      local_268.refcount._4_4_ = (uint)((ulong)piVar19 >> 0x20);
      local_268.elemsize._0_4_ = (int)sVar25;
      local_268.elemsize._4_4_ = (undefined4)(sVar25 >> 0x20);
      local_268.dims = (int)uVar27;
      local_268.w = (int)((ulong)uVar27 >> 0x20);
      local_268.h = (int)uVar28;
      local_268.d = (int)((ulong)uVar28 >> 0x20);
      if (!bVar26) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_268.allocator == (Allocator *)0x0) goto LAB_00464234;
          (*(local_268.allocator)->_vptr_Allocator[3])(local_268.allocator,local_268.data);
        }
      }
    }
    broadcast_type_C = 0;
    if ((local_268.data != (void *)0x0) && ((long)local_268.c * local_268.cstep != 0)) {
      if (local_268.dims == 1) {
        broadcast_type_C = (uint)(local_268.w * local_268.elempack == uVar10);
        if (local_268.w * local_268.elempack == uVar21) {
          broadcast_type_C = 4;
        }
      }
      else {
        bVar26 = local_268.dims == 2;
        broadcast_type_C = 0;
        if (local_268.w == 1U && bVar26) {
          broadcast_type_C = (uint)(local_268.elempack * local_268.h == uVar10) * 2;
        }
        if ((local_268.w == 1U && bVar26 || bVar26) && (local_268.w == uVar21)) {
          if (local_268.elempack * local_268.h == uVar10) {
            broadcast_type_C = 3;
          }
          if (local_268.elempack * local_268.h == 1) {
            broadcast_type_C = 4;
          }
        }
      }
      if ((this->super_Gemm).beta != 1.0) {
        local_1c8.cstep = 0;
        local_1c8.data = (void *)0x0;
        local_1c8.refcount._0_4_ = 0;
        local_1c8.refcount._4_4_ = 0;
        local_1c8.elemsize._0_4_ = 0;
        local_1c8.elemsize._4_4_ = 0;
        local_1c8.elempack = 0;
        local_1c8.allocator = (Allocator *)0x0;
        local_1c8.dims = 0;
        local_1c8.d = 0;
        local_1c8.c = 0;
        local_1c8.w = local_1c8.refcount._4_4_;
        local_1c8.h = (int)local_1c8.elemsize;
        Mat::create_like(&local_1c8,&local_268,opt->workspace_allocator);
        uVar13 = local_268.c * (int)local_268.cstep * local_268.elempack;
        uVar24 = 0;
        uVar14 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar14 = uVar24;
        }
        for (; uVar14 != uVar24; uVar24 = uVar24 + 1) {
          *(float *)((long)local_1c8.data + uVar24 * 4) =
               (this->super_Gemm).beta * *(float *)((long)local_268.data + uVar24 * 4);
        }
        piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
        }
        piVar19 = (int *)CONCAT44(local_268.refcount._4_4_,local_268.refcount._0_4_);
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_268.allocator == (Allocator *)0x0) {
              free(local_268.data);
            }
            else {
              (*(local_268.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        local_268.data = local_1c8.data;
        local_268.refcount._0_4_ = local_1c8.refcount._0_4_;
        local_268.refcount._4_4_ = local_1c8.refcount._4_4_;
        local_268.elemsize._0_4_ = (int)local_1c8.elemsize;
        local_268.elemsize._4_4_ = local_1c8.elemsize._4_4_;
        local_268.elempack = local_1c8.elempack;
        local_268.allocator = local_1c8.allocator;
        local_268.dims = local_1c8.dims;
        local_268.w = local_1c8.w;
        local_268.h = local_1c8.h;
        local_268.d = local_1c8.d;
        local_268.c = local_1c8.c;
        local_268.cstep = local_1c8.cstep;
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_1c8.allocator == (Allocator *)0x0) {
              free(local_1c8.data);
            }
            else {
              (*(local_1c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
  }
  else {
    if (&local_268 != &this->CT_data) {
      piVar19 = (this->CT_data).refcount;
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + 1;
        UNLOCK();
      }
      local_268.data = (this->CT_data).data;
      piVar19 = (this->CT_data).refcount;
      local_268.refcount._0_4_ = SUB84(piVar19,0);
      local_268.refcount._4_4_ = (uint)((ulong)piVar19 >> 0x20);
      sVar25 = (this->CT_data).elemsize;
      local_268.elemsize._0_4_ = (int)sVar25;
      local_268.elemsize._4_4_ = (undefined4)(sVar25 >> 0x20);
      local_268.elempack = (this->CT_data).elempack;
      local_268.allocator = (this->CT_data).allocator;
      uVar2 = (this->CT_data).dims;
      uVar3 = (this->CT_data).w;
      uVar4 = (this->CT_data).h;
      uVar5 = (this->CT_data).d;
      local_268.c = (this->CT_data).c;
      local_268.cstep = (this->CT_data).cstep;
      local_268.dims = uVar2;
      local_268.w = uVar3;
      local_268.h = uVar4;
      local_268.d = uVar5;
    }
    broadcast_type_C = (this->super_Gemm).constant_broadcast_type_C;
  }
  iVar7 = (this->super_Gemm).output_transpose;
  if (opt->use_packing_layout == true) {
    uVar13 = uVar21;
    if (iVar7 == 0) {
      uVar13 = uVar10;
    }
    local_80 = 8;
    if ((uVar13 & 7) != 0) {
      local_80 = (ulong)((uVar13 & 3) == 0) * 3 + 1;
    }
  }
  else {
    local_80 = 1;
  }
  uVar13 = (this->super_Gemm).output_elempack;
  if (uVar13 != 0) {
    local_80 = (ulong)uVar13;
  }
  iVar11 = (int)local_80;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar13 = uVar21;
  if (iVar7 != 0) {
    uVar13 = uVar10;
    uVar10 = uVar21;
  }
  if ((this->super_Gemm).output_N1M == 0) {
    Mat::create(this_00,uVar13,(int)uVar10 / iVar11,(ulong)(uint)(iVar11 * 4),iVar11,
                opt->blob_allocator);
  }
  else {
    Mat::create(this_00,uVar13,1,(int)uVar10 / iVar11,(ulong)(uint)(iVar11 * 4),iVar11,
                opt->blob_allocator);
  }
  local_2c8 = 0xffffffffffffff9c;
  if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) goto LAB_00464549;
  iVar7 = *(int *)&(this->super_Gemm).field_0x244;
  iVar11 = iVar7;
  if (iVar7 == 0) {
    iVar11 = opt->num_threads;
  }
  if (opt->num_threads != iVar7 && iVar7 != 0) {
    fprintf(_stderr,"opt.num_threads %d changed, gemm will use load-time value %d");
    fputc(10,_stderr);
  }
  iVar7 = (this->super_Gemm).constantA;
  iVar17 = (this->super_Gemm).constantB;
  if (iVar17 == 0 || iVar7 == 0) {
    pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (iVar7 == 0) {
      if (iVar17 == 0) {
        iVar7 = (this->super_Gemm).transA;
        iVar17 = (this->super_Gemm).transB;
        local_278 = CONCAT44(local_278._4_4_,iVar7);
        if (iVar7 == 0) {
          iVar7 = pMVar23->elempack * (&pMVar23->h)[(ulong)(pMVar23->dims == 3) * 2];
          iVar18 = pMVar23->w;
        }
        else {
          iVar7 = pMVar23->w;
          iVar18 = pMVar23->elempack * (&pMVar23->h)[(ulong)(pMVar23->dims == 3) * 2];
        }
        if (iVar17 == 0) {
          uVar10 = pMVar23[1].w;
        }
        else {
          uVar10 = pMVar23[1].elempack * (&pMVar23[1].h)[(ulong)(pMVar23[1].dims == 3) * 2];
        }
        uVar14 = (ulong)uVar10;
        local_280 = CONCAT44(local_280._4_4_,(local_2a0->super_Gemm).output_transpose);
        get_optimal_tile_mnk
                  (iVar7,uVar10,iVar18,(local_2a0->super_Gemm).constant_TILE_M,
                   (local_2a0->super_Gemm).constant_TILE_N,(local_2a0->super_Gemm).constant_TILE_K,
                   &TILE_N,&TILE_K,&TILE_K_2,iVar11);
        local_d8 = (Mat *)(ulong)(uint)TILE_N;
        local_2bc = (iVar7 + TILE_N + -1) / TILE_N;
        iVar7 = (int)(uVar10 + TILE_K + -1) / TILE_K;
        iVar16 = (iVar18 + TILE_K_2 + -1) / TILE_K_2;
        local_1c8.cstep = 0;
        local_1c8.data = (void *)0x0;
        local_1c8.refcount._0_4_ = 0;
        local_1c8.refcount._4_4_ = 0;
        local_1c8.elemsize._0_4_ = 0;
        local_1c8.elemsize._4_4_ = 0;
        local_1c8.elempack = 0;
        local_1c8.allocator = (Allocator *)0x0;
        local_1c8.dims = 0;
        local_1c8.w = 0;
        local_1c8.h = 0;
        local_1c8.d = 0;
        local_1c8.c = 0;
        Mat::create(&local_1c8,TILE_K_2 * TILE_N,iVar16,iVar11,4,opt->workspace_allocator);
        local_2c8 = 0xffffffffffffff9c;
        local_298 = uVar14;
        if ((local_1c8.data != (void *)0x0) && ((long)local_1c8.c * local_1c8.cstep != 0)) {
          local_218.cstep = 0;
          local_218.data = (void *)0x0;
          local_218.refcount._0_4_ = 0;
          local_218.refcount._4_4_ = 0;
          local_218.elemsize._0_4_ = 0;
          local_218.elemsize._4_4_ = 0;
          local_218.elempack = 0;
          local_218.allocator = (Allocator *)0x0;
          local_218.dims = 0;
          local_218.w = 0;
          local_218.h = 0;
          local_218.d = 0;
          local_218.c = 0;
          Mat::create(&local_218,TILE_K_2 * TILE_K,iVar16,iVar7,4,opt->workspace_allocator);
          local_2c8 = 0xffffffffffffff9c;
          if ((local_218.data != (void *)0x0) && ((long)local_218.c * local_218.cstep != 0)) {
            iVar7 = iVar16 * iVar7;
            iVar8 = 0;
            if (iVar7 < 1) {
              iVar7 = iVar8;
            }
            for (; uVar14 = local_298, iVar7 != iVar8; iVar8 = iVar8 + 1) {
              iVar12 = (iVar8 / iVar16) * TILE_K;
              iVar15 = (int)((long)iVar8 % (long)iVar16) * TILE_K_2;
              iVar22 = (int)local_298 - iVar12;
              if (TILE_K < iVar22) {
                iVar22 = TILE_K;
              }
              iVar9 = iVar18 - iVar15;
              if (TILE_K_2 < iVar18 - iVar15) {
                iVar9 = TILE_K_2;
              }
              local_178.cstep = (size_t)local_218.w;
              local_178.data =
                   (void *)((long)local_218.data +
                           ((long)iVar8 % (long)iVar16 & 0xffffffffU) * local_178.cstep *
                           CONCAT44(local_218.elemsize._4_4_,(int)local_218.elemsize) +
                           (long)(iVar8 / iVar16) * local_218.cstep *
                           CONCAT44(local_218.elemsize._4_4_,(int)local_218.elemsize));
              local_178.refcount._0_4_ = 0;
              local_178.refcount._4_4_ = 0;
              local_178.elemsize._0_4_ = (int)local_218.elemsize;
              local_178.elemsize._4_4_ = local_218.elemsize._4_4_;
              local_178.elempack = local_218.elempack;
              local_178.allocator = local_218.allocator;
              local_178.dims = 2;
              local_178.w = local_218.w;
              local_178.h = 1;
              local_178.d = 1;
              local_178.c = 1;
              if (iVar17 == 0) {
                transpose_pack_B_tile(pMVar23 + 1,&local_178,iVar12,iVar22,iVar15,iVar9);
              }
              else {
                pack_B_tile(pMVar23 + 1,&local_178,iVar12,iVar22,iVar15,iVar9);
              }
            }
            local_178.cstep = 0;
            local_178.data = (void *)0x0;
            local_178.refcount._0_4_ = 0;
            local_178.refcount._4_4_ = 0;
            local_178.elemsize._0_4_ = 0;
            local_178.elemsize._4_4_ = 0;
            local_178.elempack = 0;
            local_178.allocator = (Allocator *)0x0;
            local_178.dims = 0;
            local_178.w = 0;
            local_178.h = 0;
            local_178.d = 0;
            local_178.c = 0;
            if ((((int)local_280 == 0) && (broadcast_type_C != 3)) && (iVar18 <= TILE_K_2)) {
LAB_00463bb2:
              bVar26 = (int)local_280 == 0;
              local_2c8 = 0;
              if (local_2bc < 1) {
                local_2bc = 0;
              }
              iVar7 = 0;
              while (iVar7 != local_2bc) {
                if ((int)local_278 == 0) {
                  iVar11 = pMVar23->elempack * (&pMVar23->h)[(ulong)(pMVar23->dims == 3) * 2];
                  iVar17 = pMVar23->w;
                }
                else {
                  iVar11 = pMVar23->w;
                  iVar17 = pMVar23->elempack * (&pMVar23->h)[(ulong)(pMVar23->dims == 3) * 2];
                }
                local_290 = CONCAT44(local_290._4_4_,iVar17);
                iVar16 = (int)local_d8;
                iVar8 = iVar7 * iVar16;
                iVar18 = iVar11 - iVar8;
                if (iVar16 < iVar11 - iVar8) {
                  iVar18 = iVar16;
                }
                local_128.cstep = 0;
                local_128.data = (void *)0x0;
                local_128.refcount._0_4_ = 0;
                local_128.refcount._4_4_ = 0;
                local_128.elemsize._0_4_ = 0;
                local_128.elemsize._4_4_ = 0;
                local_128.elempack = 0;
                local_128.h = 0;
                local_128.d = 0;
                local_128.c = 0;
                local_128.allocator = (Allocator *)0x0;
                local_128.dims = 0;
                local_128.w = 0;
                if ((((int)local_280 != 0) || (broadcast_type_C == 3)) || (TILE_K_2 < iVar17)) {
                  iVar11 = get_omp_thread_num();
                  uVar24 = CONCAT44(local_178.elemsize._4_4_,(int)local_178.elemsize);
                  local_128.cstep =
                       ((long)local_178.w * (long)local_178.h * uVar24 + 0xf & 0xfffffffffffffff0) /
                       uVar24;
                  if (local_178.dims == 4) {
                    local_128.cstep = (long)local_178.w * (long)local_178.h;
                  }
                  local_128.dims = local_178.dims + -1;
                  local_128.data =
                       (void *)((long)iVar11 * uVar24 * local_178.cstep + (long)local_178.data);
                  local_128.elemsize._0_4_ = (int)local_178.elemsize;
                  local_128.elemsize._4_4_ = local_178.elemsize._4_4_;
                  local_128.elempack = local_178.elempack;
                  local_128.allocator = local_178.allocator;
                  local_128.w = local_178.w;
                  local_128.h = local_178.h;
                  local_128.d = 1;
                  local_128.c = local_178.d;
                }
                local_128.refcount._4_4_ = 0;
                local_128.refcount._0_4_ = 0;
                local_130 = CONCAT44(local_130._4_4_,iVar7);
                uVar24 = 0;
                iVar7 = (int)local_290;
                while( true ) {
                  iVar11 = (int)uVar24;
                  uVar10 = (int)uVar14 - iVar11;
                  if (uVar10 == 0 || (int)uVar14 < iVar11) break;
                  if (TILE_K < (int)uVar10) {
                    uVar10 = TILE_K;
                  }
                  local_180 = &local_268;
                  if (broadcast_type_C == 3) {
                    pack_A_tile(&local_268,&local_128,iVar8,iVar18,iVar11,uVar10);
                    local_180 = &local_128;
                  }
                  iVar11 = iVar7;
                  local_2b8 = uVar24;
                  local_288 = (ulong)uVar10;
                  iVar17 = 0;
                  while (iVar17 < iVar7) {
                    iVar16 = iVar11;
                    if (TILE_K_2 < iVar11) {
                      iVar16 = TILE_K_2;
                    }
                    iVar7 = get_omp_thread_num();
                    local_c0 = CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize);
                    local_90 = (size_t)local_1c8.w;
                    _TILE_M_3 = (void *)((long)local_1c8.data +
                                        local_c0 * local_90 * (long)(iVar17 / TILE_K_2) +
                                        (long)iVar7 * local_1c8.cstep * local_c0);
                    local_c8 = (int *)0x0;
                    local_b8 = local_1c8.elempack;
                    local_b0 = local_1c8.allocator;
                    local_a8 = 2;
                    local_a4 = local_1c8.w;
                    local_a0._0_4_ = 1;
                    local_a0._4_4_ = 1;
                    local_98 = 1;
                    local_68 = CONCAT44(local_218.elemsize._4_4_,(int)local_218.elemsize);
                    local_38 = (size_t)local_218.w;
                    _TILE_M = (void *)((long)local_218.data +
                                      local_38 * local_68 * (long)(iVar17 / TILE_K_2) +
                                      (long)(int)((long)((ulong)(uint)((int)local_2b8 >> 0x1f) <<
                                                         0x20 | local_2b8 & 0xffffffff) /
                                                 (long)TILE_K) * local_218.cstep * local_68);
                    local_70 = (int *)0x0;
                    local_60 = local_218.elempack;
                    local_58 = local_218.allocator;
                    local_4c = local_218.w;
                    local_48._0_4_ = 1;
                    local_48._4_4_ = 1;
                    local_50 = local_a8;
                    local_40 = local_98;
                    if ((int)local_2b8 == 0) {
                      if ((int)local_278 == 0) {
                        pack_A_tile(pMVar23,(Mat *)&TILE_M_3,iVar8,iVar18,iVar17,iVar16);
                      }
                      else {
                        transpose_pack_A_tile(pMVar23,(Mat *)&TILE_M_3,iVar8,iVar18,iVar17,iVar16);
                      }
                    }
                    iVar7 = (int)local_290;
                    gemm_transB_packed_tile
                              ((Mat *)&TILE_M_3,(Mat *)&TILE_M,local_180,&local_128,this_00,
                               broadcast_type_C,iVar8,iVar18,(int)local_2b8,(int)local_288,iVar17,
                               iVar16,(int)local_290 <= iVar17 + TILE_K_2 && bVar26);
                    iVar11 = iVar11 - TILE_K_2;
                    iVar17 = iVar17 + TILE_K_2;
                  }
                  iVar11 = (int)local_2b8;
                  if ((int)local_280 != 0) {
                    transpose_unpack_output_tile
                              (&local_128,this_00,iVar8,iVar18,iVar11,(int)local_288);
                  }
                  uVar24 = (ulong)(uint)(iVar11 + TILE_K);
                  uVar14 = local_298;
                }
                iVar7 = (int)local_130 + 1;
              }
            }
            else {
              Mat::create(&local_178,TILE_K * (int)local_d8,1,iVar11,4,opt->workspace_allocator);
              local_2c8 = 0xffffffffffffff9c;
              if ((local_178.data != (void *)0x0) && ((long)local_178.c * local_178.cstep != 0))
              goto LAB_00463bb2;
            }
            piVar19 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
            if (piVar19 != (int *)0x0) {
              LOCK();
              *piVar19 = *piVar19 + -1;
              UNLOCK();
              if (*piVar19 == 0) {
                if (local_178.allocator == (Allocator *)0x0) {
                  free(local_178.data);
                }
                else {
                  (*(local_178.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar19 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
          if (piVar19 != (int *)0x0) {
            LOCK();
            *piVar19 = *piVar19 + -1;
            UNLOCK();
            if (*piVar19 == 0) {
              if (local_218.allocator == (Allocator *)0x0) {
                free(local_218.data);
              }
              else {
                (*(local_218.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        this = local_2a0;
        piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_1c8.allocator == (Allocator *)0x0) goto LAB_0046453a;
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      else {
        iVar7 = (this->super_Gemm).transA;
        iVar17 = (this->super_Gemm).constantN;
        local_278 = CONCAT44(local_278._4_4_,iVar17);
        iVar18 = (this->super_Gemm).constantK;
        if (iVar7 == 0) {
          iVar16 = pMVar23->elempack * (&pMVar23->h)[(ulong)(pMVar23->dims == 3) * 2];
        }
        else {
          iVar16 = pMVar23->w;
        }
        local_298 = CONCAT44(local_298._4_4_,(local_2a0->super_Gemm).output_transpose);
        get_optimal_tile_mnk
                  (iVar16,iVar17,iVar18,(this->super_Gemm).constant_TILE_M,
                   (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                   &TILE_N,&TILE_K,iVar11);
        local_130 = (ulong)_TILE_M & 0xffffffff;
        iVar17 = (iVar16 + TILE_M + -1) / TILE_M;
        local_1c8.cstep = 0;
        local_1c8.data = (void *)0x0;
        local_1c8.refcount._0_4_ = 0;
        local_1c8.refcount._4_4_ = 0;
        local_1c8.elemsize._0_4_ = 0;
        local_1c8.elemsize._4_4_ = 0;
        local_1c8.elempack = 0;
        local_1c8.allocator = (Allocator *)0x0;
        local_1c8.dims = 0;
        local_1c8.w = 0;
        local_1c8.h = 0;
        local_1c8.d = 0;
        local_1c8.c = 0;
        Mat::create(&local_1c8,TILE_K * TILE_M,(iVar18 + TILE_K + -1) / TILE_K,iVar11,4,
                    opt->workspace_allocator);
        local_2c8 = 0xffffffffffffff9c;
        if ((local_1c8.data != (void *)0x0) && ((long)local_1c8.c * local_1c8.cstep != 0)) {
          local_218.cstep = 0;
          local_218.data = (void *)0x0;
          local_218.refcount._0_4_ = 0;
          local_218.refcount._4_4_ = 0;
          local_218.elemsize._0_4_ = 0;
          local_218.elemsize._4_4_ = 0;
          local_218.elempack = 0;
          local_218.allocator = (Allocator *)0x0;
          local_218.dims = 0;
          local_218.w = 0;
          local_218.h = 0;
          local_218.d = 0;
          local_218.c = 0;
          if (((int)local_298 == 0) && ((broadcast_type_C != 3 && (iVar18 <= TILE_K)))) {
LAB_00463156:
            local_290 = CONCAT71(local_290._1_7_,(int)local_298 == 0);
            local_2c8 = 0;
            if (iVar17 < 1) {
              iVar17 = 0;
            }
            iVar11 = 0;
            local_2bc = iVar17;
            while (iVar11 != local_2bc) {
              if (iVar7 == 0) {
                iVar17 = pMVar23->elempack * (&pMVar23->h)[(ulong)(pMVar23->dims == 3) * 2];
                iVar18 = pMVar23->w;
              }
              else {
                iVar17 = pMVar23->w;
                iVar18 = pMVar23->elempack * (&pMVar23->h)[(ulong)(pMVar23->dims == 3) * 2];
              }
              iVar8 = (int)local_130;
              iVar22 = iVar11 * iVar8;
              iVar16 = iVar17 - iVar22;
              if (iVar8 < iVar17 - iVar22) {
                iVar16 = iVar8;
              }
              local_178.cstep = 0;
              local_178.data = (void *)0x0;
              local_178.refcount._0_4_ = 0;
              local_178.refcount._4_4_ = 0;
              local_178.elemsize._0_4_ = 0;
              local_178.elemsize._4_4_ = 0;
              local_178.elempack = 0;
              local_178.h = 0;
              local_178.d = 0;
              local_178.c = 0;
              local_178.allocator = (Allocator *)0x0;
              local_178.dims = 0;
              local_178.w = 0;
              if ((((int)local_298 != 0) || (broadcast_type_C == 3)) || (TILE_K < iVar18)) {
                iVar17 = get_omp_thread_num();
                uVar14 = CONCAT44(local_218.elemsize._4_4_,(int)local_218.elemsize);
                local_178.cstep =
                     ((long)local_218.w * (long)local_218.h * uVar14 + 0xf & 0xfffffffffffffff0) /
                     uVar14;
                if (local_218.dims == 4) {
                  local_178.cstep = (long)local_218.w * (long)local_218.h;
                }
                local_178.dims = local_218.dims + -1;
                local_178.data =
                     (void *)((long)iVar17 * uVar14 * local_218.cstep + (long)local_218.data);
                local_178.elemsize._0_4_ = (int)local_218.elemsize;
                local_178.elemsize._4_4_ = local_218.elemsize._4_4_;
                local_178.elempack = local_218.elempack;
                local_178.allocator = local_218.allocator;
                local_178.w = local_218.w;
                local_178.h = local_218.h;
                local_178.d = 1;
                local_178.c = local_218.d;
              }
              iVar17 = TILE_N;
              local_178.refcount._4_4_ = 0;
              local_178.refcount._0_4_ = 0;
              local_280 = CONCAT44(local_280._4_4_,iVar11);
              uVar14 = 0;
              while( true ) {
                iVar11 = (int)uVar14;
                uVar10 = (int)local_278 - iVar11;
                if (uVar10 == 0 || (int)local_278 < iVar11) break;
                if (iVar17 < (int)uVar10) {
                  uVar10 = iVar17;
                }
                local_180 = &local_268;
                if (broadcast_type_C == 3) {
                  pack_A_tile(&local_268,&local_178,iVar22,iVar16,iVar11,uVar10);
                  local_180 = &local_178;
                }
                iVar11 = iVar18;
                local_2b8 = uVar14;
                local_288 = (ulong)uVar10;
                iVar8 = 0;
                while (iVar8 < iVar18) {
                  iVar12 = iVar11;
                  if (TILE_K < iVar11) {
                    iVar12 = TILE_K;
                  }
                  iVar15 = get_omp_thread_num();
                  local_128.cstep = (size_t)local_1c8.w;
                  local_128.data =
                       (void *)((long)local_1c8.data +
                               CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize) *
                               local_128.cstep * (long)(iVar8 / TILE_K) +
                               (long)iVar15 * local_1c8.cstep *
                               CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize));
                  local_128.refcount._0_4_ = 0;
                  local_128.refcount._4_4_ = 0;
                  local_128.elemsize._0_4_ = (int)local_1c8.elemsize;
                  local_128.elemsize._4_4_ = local_1c8.elemsize._4_4_;
                  local_128.elempack = local_1c8.elempack;
                  local_128.allocator = local_1c8.allocator;
                  local_128.dims = 2;
                  local_128.w = local_1c8.w;
                  local_128.h = 1;
                  local_128.d = 1;
                  local_128.c = 1;
                  local_c0 = (local_2a0->BT_data).elemsize;
                  local_a4 = (local_2a0->BT_data).w;
                  local_90 = (size_t)(int)local_a4;
                  local_b8 = (local_2a0->BT_data).elempack;
                  local_b0 = (local_2a0->BT_data).allocator;
                  local_c8 = (int *)0x0;
                  _TILE_M_3 = (void *)((long)(local_2a0->BT_data).data +
                                      local_90 * local_c0 * (long)(iVar8 / TILE_K) +
                                      (long)(int)((long)((ulong)(uint)((int)local_2b8 >> 0x1f) <<
                                                         0x20 | local_2b8 & 0xffffffff) /
                                                 (long)iVar17) * (local_2a0->BT_data).cstep *
                                      local_c0);
                  local_a0._0_4_ = 1;
                  local_a0._4_4_ = 1;
                  local_a8 = local_128.dims;
                  local_98 = local_128.c;
                  if ((int)local_2b8 == 0) {
                    if (iVar7 == 0) {
                      pack_A_tile(pMVar23,&local_128,iVar22,iVar16,iVar8,iVar12);
                    }
                    else {
                      transpose_pack_A_tile(pMVar23,&local_128,iVar22,iVar16,iVar8,iVar12);
                    }
                  }
                  gemm_transB_packed_tile
                            (&local_128,(Mat *)&TILE_M_3,local_180,&local_178,this_00,
                             broadcast_type_C,iVar22,iVar16,(int)local_2b8,(int)local_288,iVar8,
                             iVar12,(bool)(iVar18 <= TILE_K + iVar8 & (byte)local_290));
                  iVar11 = iVar11 - TILE_K;
                  iVar8 = TILE_K + iVar8;
                }
                iVar11 = (int)local_2b8;
                if ((int)local_298 != 0) {
                  transpose_unpack_output_tile
                            (&local_178,this_00,iVar22,iVar16,iVar11,(int)local_288);
                }
                uVar14 = (ulong)(uint)(iVar11 + iVar17);
              }
              iVar11 = (int)local_280 + 1;
            }
          }
          else {
            Mat::create(&local_218,TILE_N * (int)local_130,1,iVar11,4,opt->workspace_allocator);
            local_2c8 = 0xffffffffffffff9c;
            if ((local_218.data != (void *)0x0) && ((long)local_218.c * local_218.cstep != 0))
            goto LAB_00463156;
          }
          piVar19 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
          if (piVar19 != (int *)0x0) {
            LOCK();
            *piVar19 = *piVar19 + -1;
            UNLOCK();
            if (*piVar19 == 0) {
              if (local_218.allocator == (Allocator *)0x0) {
                free(local_218.data);
              }
              else {
                (*(local_218.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        this = local_2a0;
        piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_1c8.allocator != (Allocator *)0x0) {
              (*(local_1c8.allocator)->_vptr_Allocator[3])();
              goto LAB_00464542;
            }
            goto LAB_0046453a;
          }
        }
      }
    }
    else {
      iVar7 = (this->super_Gemm).transB;
      uVar10 = (this->super_Gemm).constantM;
      iVar17 = (this->super_Gemm).constantK;
      if (iVar7 == 0) {
        uVar21 = pMVar23->w;
      }
      else {
        uVar21 = pMVar23->elempack * (&pMVar23->h)[(ulong)(pMVar23->dims == 3) * 2];
      }
      local_290 = (ulong)uVar21;
      iVar18 = (this->super_Gemm).output_transpose;
      get_optimal_tile_mnk
                (uVar10,uVar21,iVar17,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,iVar11);
      local_298 = (ulong)_TILE_M & 0xffffffff;
      local_278 = (long)(int)(uVar10 + TILE_M + -1) / (long)TILE_M & 0xffffffff;
      local_2b8 = (ulong)(uint)TILE_N;
      iVar16 = ((int)local_290 + TILE_N + -1) / TILE_N;
      iVar8 = (iVar17 + TILE_K + -1) / TILE_K;
      local_1c8.cstep = 0;
      local_1c8.data = (void *)0x0;
      local_1c8.refcount._0_4_ = 0;
      local_1c8.refcount._4_4_ = 0;
      local_1c8.elemsize._0_4_ = 0;
      local_1c8.elemsize._4_4_ = 0;
      local_1c8.elempack = 0;
      local_1c8.allocator = (Allocator *)0x0;
      local_1c8.dims = 0;
      local_1c8.w = 0;
      local_1c8.h = 0;
      local_1c8.d = 0;
      local_1c8.c = 0;
      local_280 = (ulong)uVar10;
      Mat::create(&local_1c8,TILE_K * TILE_N,iVar8,iVar16,4,opt->workspace_allocator);
      local_2c8 = 0xffffffffffffff9c;
      if ((local_1c8.data != (void *)0x0) && ((long)local_1c8.c * local_1c8.cstep != 0)) {
        iVar16 = iVar16 * iVar8;
        iVar22 = 0;
        if (iVar16 < 1) {
          iVar16 = 0;
        }
        for (; uVar14 = local_290, iVar12 = (int)local_2b8, iVar16 != iVar22; iVar22 = iVar22 + 1) {
          iVar9 = (iVar22 / iVar8) * iVar12;
          k = (int)((long)iVar22 % (long)iVar8) * TILE_K;
          iVar15 = (int)local_290 - iVar9;
          if (iVar12 < iVar15) {
            iVar15 = iVar12;
          }
          iVar12 = iVar17 - k;
          if (TILE_K < iVar17 - k) {
            iVar12 = TILE_K;
          }
          local_218.cstep = (size_t)local_1c8.w;
          local_218.data =
               (void *)((long)local_1c8.data +
                       ((long)iVar22 % (long)iVar8 & 0xffffffffU) * local_218.cstep *
                       CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize) +
                       (long)(iVar22 / iVar8) * local_1c8.cstep *
                       CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize));
          local_218.refcount._0_4_ = 0;
          local_218.refcount._4_4_ = 0;
          local_218.elemsize._0_4_ = (int)local_1c8.elemsize;
          local_218.elemsize._4_4_ = local_1c8.elemsize._4_4_;
          local_218.elempack = local_1c8.elempack;
          local_218.allocator = local_1c8.allocator;
          local_218.dims = 2;
          local_218.w = local_1c8.w;
          local_218.h = 1;
          local_218.d = 1;
          local_218.c = 1;
          if (iVar7 == 0) {
            transpose_pack_B_tile(pMVar23,&local_218,iVar9,iVar15,k,iVar12);
          }
          else {
            pack_B_tile(pMVar23,&local_218,iVar9,iVar15,k,iVar12);
          }
        }
        local_218.cstep = 0;
        local_218.data = (void *)0x0;
        local_218.refcount._0_4_ = 0;
        local_218.refcount._4_4_ = 0;
        local_218.elemsize._0_4_ = 0;
        local_218.elemsize._4_4_ = 0;
        local_218.elempack = 0;
        local_218.allocator = (Allocator *)0x0;
        local_218.dims = 0;
        local_218.w = 0;
        local_218.h = 0;
        local_218.d = 0;
        local_218.c = 0;
        if (iVar18 != 0 || (broadcast_type_C == 3 || TILE_K < iVar17)) {
          Mat::create(&local_218,iVar12 * (int)local_298,1,iVar11,4,opt->workspace_allocator);
          local_2c8 = 0xffffffffffffff9c;
          if ((local_218.data != (void *)0x0) && ((long)local_218.c * local_218.cstep != 0))
          goto LAB_00462a0c;
        }
        else {
LAB_00462a0c:
          local_180 = (Mat *)CONCAT71(local_180._1_7_,iVar18 == 0);
          iVar7 = (int)local_278;
          local_2c8 = 0;
          local_278 = local_278 & 0xffffffff;
          if (iVar7 < 1) {
            local_278 = 0;
          }
          for (uVar24 = 0; uVar24 != local_278; uVar24 = uVar24 + 1) {
            iVar7 = (int)uVar24 * (int)local_298;
            uVar10 = (int)local_280 - iVar7;
            local_288 = (ulong)uVar10;
            if ((int)local_298 < (int)uVar10) {
              local_288 = local_298 & 0xffffffff;
            }
            local_178.cstep = 0;
            local_178.data = (void *)0x0;
            local_178.refcount._0_4_ = 0;
            local_178.refcount._4_4_ = 0;
            local_178.elemsize._0_4_ = 0;
            local_178.elemsize._4_4_ = 0;
            local_178.elempack = 0;
            local_178.h = 0;
            local_178.d = 0;
            local_178.c = 0;
            local_178.allocator = (Allocator *)0x0;
            local_178.dims = 0;
            local_178.w = 0;
            if (iVar18 != 0 || (broadcast_type_C == 3 || TILE_K < iVar17)) {
              iVar11 = get_omp_thread_num();
              uVar6 = CONCAT44(local_218.elemsize._4_4_,(int)local_218.elemsize);
              local_178.cstep =
                   ((long)local_218.w * (long)local_218.h * uVar6 + 0xf & 0xfffffffffffffff0) /
                   uVar6;
              if (local_218.dims == 4) {
                local_178.cstep = (long)local_218.w * (long)local_218.h;
              }
              local_178.dims = local_218.dims + -1;
              local_178.data =
                   (void *)((long)iVar11 * uVar6 * local_218.cstep + (long)local_218.data);
              local_178.elemsize._0_4_ = (int)local_218.elemsize;
              local_178.elemsize._4_4_ = local_218.elemsize._4_4_;
              local_178.elempack = local_218.elempack;
              local_178.allocator = local_218.allocator;
              local_178.w = local_218.w;
              local_178.h = local_218.h;
              local_178.d = 1;
              local_178.c = local_218.d;
            }
            local_178.refcount._4_4_ = 0;
            local_178.refcount._0_4_ = 0;
            for (iVar11 = 0; iVar16 = (int)uVar14 - iVar11, iVar16 != 0 && iVar11 <= (int)uVar14;
                iVar11 = iVar11 + (int)local_2b8) {
              if ((int)local_2b8 < iVar16) {
                iVar16 = (int)local_2b8;
              }
              local_300 = &local_268;
              if (broadcast_type_C == 3) {
                local_300 = &local_178;
                pack_A_tile(&local_268,local_300,iVar7,(int)local_288,iVar11,iVar16);
              }
              iVar8 = iVar17;
              iVar22 = 0;
              while (iVar22 < iVar17) {
                iVar12 = iVar8;
                if (TILE_K < iVar8) {
                  iVar12 = TILE_K;
                }
                sVar25 = (local_2a0->AT_data).elemsize;
                local_128.w = (local_2a0->AT_data).w;
                local_128.cstep = (size_t)local_128.w;
                local_128.elempack = (local_2a0->AT_data).elempack;
                local_128.allocator = (local_2a0->AT_data).allocator;
                local_128.data =
                     (void *)((long)(local_2a0->AT_data).data +
                             sVar25 * local_128.cstep * (long)(iVar22 / TILE_K) +
                             (local_2a0->AT_data).cstep * uVar24 * sVar25);
                local_128.refcount._0_4_ = 0;
                local_128.refcount._4_4_ = 0;
                local_128.elemsize._0_4_ = (int)sVar25;
                local_128.elemsize._4_4_ = (undefined4)(sVar25 >> 0x20);
                local_128.dims = 2;
                local_128.h = 1;
                local_128.d = 1;
                local_128.c = 1;
                local_90 = (size_t)local_1c8.w;
                local_c0 = CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize);
                _TILE_M_3 = (void *)((long)local_1c8.data +
                                    local_90 * local_c0 * (long)(iVar22 / TILE_K) +
                                    (long)(iVar11 / (int)local_2b8) * local_1c8.cstep * local_c0);
                local_c8 = (int *)0x0;
                iVar8 = -(TILE_K - iVar8);
                local_b8 = local_1c8.elempack;
                local_b0 = local_1c8.allocator;
                local_a4 = local_1c8.w;
                local_a0._0_4_ = 1;
                local_a0._4_4_ = 1;
                local_a8 = local_128.dims;
                local_98 = local_128.c;
                gemm_transB_packed_tile
                          (&local_128,(Mat *)&TILE_M_3,local_300,&local_178,this_00,broadcast_type_C
                           ,iVar7,(int)local_288,iVar11,iVar16,iVar22,iVar12,
                           (bool)(iVar17 <= iVar22 + TILE_K & (byte)local_180));
                iVar22 = iVar22 + TILE_K;
              }
              if (iVar18 != 0) {
                transpose_unpack_output_tile(&local_178,this_00,iVar7,(int)local_288,iVar11,iVar16);
              }
              uVar14 = local_290;
            }
          }
        }
        piVar19 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_218.allocator == (Allocator *)0x0) {
              free(local_218.data);
            }
            else {
              (*(local_218.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      this = local_2a0;
      piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 != 0) goto LAB_00464542;
        if (local_1c8.allocator != (Allocator *)0x0) {
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
          goto LAB_00464542;
        }
LAB_0046453a:
        free(local_1c8.data);
      }
    }
  }
  else {
    uVar10 = (this->super_Gemm).constantM;
    iVar7 = (this->super_Gemm).constantN;
    iVar17 = (this->super_Gemm).constantK;
    iVar18 = (this->super_Gemm).output_transpose;
    local_278 = CONCAT44(local_278._4_4_,iVar7);
    get_optimal_tile_mnk
              (uVar10,iVar7,iVar17,(this->super_Gemm).constant_TILE_M,
               (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M_3,
               &TILE_M,&TILE_N,iVar11);
    local_280 = (ulong)_TILE_M_3 & 0xffffffff;
    uVar14 = (long)(int)(uVar10 + TILE_M_3 + -1) / (long)TILE_M_3;
    local_1c8.cstep = 0;
    local_1c8.data = (void *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.elemsize._0_4_ = 0;
    local_1c8.elemsize._4_4_ = 0;
    local_1c8.elempack = 0;
    local_1c8.allocator = (Allocator *)0x0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.d = 0;
    local_1c8.c = 0;
    local_290 = (ulong)(uint)TILE_N;
    iVar7 = TILE_M;
    local_2bc = CONCAT31(local_2bc._1_3_,iVar18 != 0 || (broadcast_type_C == 3 || TILE_N < iVar17));
    local_130 = (ulong)uVar10;
    if (iVar18 != 0 || (broadcast_type_C == 3 || TILE_N < iVar17)) {
      Mat::create(&local_1c8,TILE_M * TILE_M_3,1,iVar11,4,opt->workspace_allocator);
      local_2c8 = 0xffffffffffffff9c;
      if ((local_1c8.data != (void *)0x0) && ((long)local_1c8.c * local_1c8.cstep != 0))
      goto LAB_00462286;
    }
    else {
LAB_00462286:
      local_2c8 = 0;
      local_d8 = (Mat *)(uVar14 & 0xffffffff);
      if ((int)uVar14 < 1) {
        local_d8 = (Mat *)0x0;
      }
      local_298 = CONCAT44(local_298._4_4_,iVar18);
      for (pMVar23 = (Mat *)0x0; pMVar23 != local_d8; pMVar23 = (Mat *)((long)&pMVar23->data + 1)) {
        iVar11 = (int)pMVar23 * (int)local_280;
        uVar10 = (int)local_130 - iVar11;
        local_288 = (ulong)uVar10;
        if ((int)local_280 < (int)uVar10) {
          local_288 = local_280 & 0xffffffff;
        }
        local_218.cstep = 0;
        local_218.data = (void *)0x0;
        local_218.refcount._0_4_ = 0;
        local_218.refcount._4_4_ = 0;
        local_218.elemsize._0_4_ = 0;
        local_218.elemsize._4_4_ = 0;
        local_218.elempack = 0;
        local_218.h = 0;
        local_218.d = 0;
        local_218.c = 0;
        local_218.allocator = (Allocator *)0x0;
        local_218.dims = 0;
        local_218.w = 0;
        if ((char)local_2bc != '\0') {
          iVar16 = get_omp_thread_num();
          uVar14 = CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize);
          local_218.cstep =
               ((long)local_1c8.w * (long)local_1c8.h * uVar14 + 0xf & 0xfffffffffffffff0) / uVar14;
          if (local_1c8.dims == 4) {
            local_218.cstep = (long)local_1c8.w * (long)local_1c8.h;
          }
          local_218.dims = local_1c8.dims + -1;
          local_218.data = (void *)((long)iVar16 * uVar14 * local_1c8.cstep + (long)local_1c8.data);
          local_218.elemsize._0_4_ = (int)local_1c8.elemsize;
          local_218.elemsize._4_4_ = local_1c8.elemsize._4_4_;
          local_218.elempack = local_1c8.elempack;
          local_218.allocator = local_1c8.allocator;
          local_218.w = local_1c8.w;
          local_218.h = local_1c8.h;
          local_218.d = 1;
          local_218.c = local_1c8.d;
        }
        local_218.refcount._4_4_ = 0;
        local_218.refcount._0_4_ = 0;
        uVar14 = 0;
        local_180 = pMVar23;
        while( true ) {
          iVar8 = (int)uVar14;
          iVar16 = (int)local_278 - iVar8;
          if (iVar16 == 0 || (int)local_278 < iVar8) break;
          if (iVar7 < iVar16) {
            iVar16 = iVar7;
          }
          local_300 = &local_268;
          if (broadcast_type_C == 3) {
            local_300 = &local_218;
            pack_A_tile(&local_268,local_300,iVar11,(int)local_288,iVar8,iVar16);
          }
          iVar8 = iVar17;
          local_2b8 = uVar14;
          iVar22 = 0;
          while( true ) {
            iVar12 = (int)local_2b8;
            if (iVar17 <= iVar22) break;
            iVar9 = (int)local_290;
            iVar15 = iVar8;
            if (iVar9 < iVar8) {
              iVar15 = iVar9;
            }
            sVar25 = (local_2a0->AT_data).elemsize;
            local_178.w = (local_2a0->AT_data).w;
            local_178.cstep = (size_t)local_178.w;
            local_178.elempack = (local_2a0->AT_data).elempack;
            local_178.allocator = (local_2a0->AT_data).allocator;
            local_178.data =
                 (void *)((long)(local_2a0->AT_data).data +
                         sVar25 * local_178.cstep * (long)(iVar22 / iVar9) +
                         (local_2a0->AT_data).cstep * (long)pMVar23 * sVar25);
            local_178.refcount._0_4_ = 0;
            local_178.refcount._4_4_ = 0;
            local_178.elemsize._0_4_ = (int)sVar25;
            local_178.elemsize._4_4_ = (undefined4)(sVar25 >> 0x20);
            local_178.dims = 2;
            local_178.h = 1;
            local_178.d = 1;
            local_178.c = 1;
            local_128.w = (local_2a0->BT_data).w;
            local_128.cstep = (size_t)local_128.w;
            sVar25 = (local_2a0->BT_data).elemsize;
            local_128.elempack = (local_2a0->BT_data).elempack;
            local_128.data =
                 (void *)((long)(local_2a0->BT_data).data +
                         local_128.cstep * sVar25 * (long)(iVar22 / iVar9) +
                         (long)(int)((long)((ulong)(uint)(iVar12 >> 0x1f) << 0x20 |
                                           local_2b8 & 0xffffffff) / (long)iVar7) *
                         (local_2a0->BT_data).cstep * sVar25);
            local_128.allocator = (local_2a0->BT_data).allocator;
            local_128.refcount._0_4_ = 0;
            local_128.refcount._4_4_ = 0;
            local_128.elemsize._0_4_ = (int)sVar25;
            local_128.elemsize._4_4_ = (undefined4)(sVar25 >> 0x20);
            iVar8 = -(iVar9 - iVar8);
            local_128.h = 1;
            local_128.d = 1;
            local_128.dims = local_178.dims;
            local_128.c = local_178.c;
            gemm_transB_packed_tile
                      (&local_178,&local_128,local_300,&local_218,this_00,broadcast_type_C,iVar11,
                       (int)local_288,iVar12,iVar16,iVar22,iVar15,
                       iVar17 <= iVar9 + iVar22 && iVar18 == 0);
            pMVar23 = local_180;
            iVar22 = iVar9 + iVar22;
          }
          if ((int)local_298 != 0) {
            transpose_unpack_output_tile(&local_218,this_00,iVar11,(int)local_288,iVar12,iVar16);
          }
          uVar14 = (ulong)(uint)(iVar12 + iVar7);
        }
        this = local_2a0;
      }
    }
    piVar19 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        if (local_1c8.allocator == (Allocator *)0x0) goto LAB_0046453a;
        (*(local_1c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00464542:
  if ((int)local_2c8 == 0) {
    if ((this->super_Gemm).alpha == 1.0) {
      local_2c8 = 0;
    }
    else {
      uVar10 = (int)local_80 * (int)this_00->cstep * this_00->c;
      local_2c8 = 0;
      if ((int)uVar10 < 1) {
        uVar10 = 0;
      }
      for (uVar14 = 0; uVar10 != uVar14; uVar14 = uVar14 + 1) {
        *(float *)((long)this_00->data + uVar14 * 4) =
             *(float *)((long)this_00->data + uVar14 * 4) * (this->super_Gemm).alpha;
      }
    }
  }
LAB_00464549:
  piVar19 = (int *)CONCAT44(local_268.refcount._4_4_,local_268.refcount._0_4_);
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (*piVar19 == 0) {
      if (local_268.allocator == (Allocator *)0x0) {
        free(local_268.data);
      }
      else {
        (*(local_268.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return (int)local_2c8;
}

Assistant:

int Gemm_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        // return Gemm::forward_int8(bottom_blobs, top_blobs, opt);
        return forward_int8(bottom_blobs, top_blobs, opt);
    }
#endif

    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }

            // pre-multiply C with beta
            if (beta != 1.f)
            {
                Mat C2;
                C2.create_like(C, opt.workspace_allocator);

                const int size = C.total() * C.elempack;
                for (int i = 0; i < size; i++)
                {
                    C2[i] = C[i] * beta;
                }

                C = C2;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86(AT_data, BT_data, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86(AT_data, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86(A, BT_data, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    if (ret != 0)
        return ret;

    // multiply top_blob with alpha
    if (alpha != 1.f)
    {
        const int size = top_blob.total() * out_elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            top_blob[i] *= alpha;
        }
    }

    return 0;
}